

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

universal_hash_function_t *
new_universal_hash_function
          (universal_hash_function_t *__return_storage_ptr__,size_t *seed,uint buckets)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  universal_hash_function_t *result;
  uint buckets_local;
  size_t *seed_local;
  
  dVar3 = rand_next(seed);
  uVar2 = (ulong)(dVar3 * 1.8446744073709552e+19);
  __return_storage_ptr__->mult =
       uVar2 | (long)(dVar3 * 1.8446744073709552e+19 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  dVar3 = rand_next(seed);
  uVar2 = (ulong)(dVar3 * 1.8446744073709552e+19);
  __return_storage_ptr__->add =
       uVar2 | (long)(dVar3 * 1.8446744073709552e+19 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  iVar1 = uint32_log2(buckets);
  __return_storage_ptr__->log2_buckets = iVar1;
  return __return_storage_ptr__;
}

Assistant:

universal_hash_function_t new_universal_hash_function( size_t * seed,
       unsigned buckets )
{
    universal_hash_function_t result;
    result.mult = (size_t) (SIZE_MAX * rand_next( seed ));
    result.add  = (size_t) (SIZE_MAX * rand_next( seed ));
    result.log2_buckets = int_log2( buckets );
    return result;
}